

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O1

QString * __thiscall
QSqlTableModel::orderByClause(QString *__return_storage_ptr__,QSqlTableModel *this)

{
  long lVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  QSqlDriver *pQVar6;
  long in_FS_OFFSET;
  QSqlField f;
  QString local_120;
  QArrayData *local_108;
  char16_t *pcStack_100;
  qsizetype local_f8;
  QArrayData *local_e8;
  char16_t *pcStack_e0;
  qsizetype local_d8;
  QString local_c8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_a8;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
  local_48 = 0xaaaaaaaaaaaaaaaa;
  local_68._16_8_ = 0xaaaaaaaaaaaaaaaa;
  uStack_50 = 0xaaaaaaaaaaaaaaaa;
  local_68.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_68._8_8_ = 0xaaaaaaaaaaaaaaaa;
  QSqlRecord::field((QSqlField *)&local_68,(QSqlRecord *)(lVar1 + 0x100),*(int *)(lVar1 + 0x230));
  bVar5 = QSqlField::isValid((QSqlField *)&local_68);
  if (bVar5) {
    local_c8.d.size = -0x5555555555555556;
    local_c8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_c8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pQVar6 = QSqlDatabase::driver((QSqlDatabase *)(lVar1 + 0x228));
    (**(code **)(*(long *)pQVar6 + 0xa0))(&local_e8,pQVar6,lVar1 + 0x298);
    qVar4 = local_d8;
    pcVar3 = pcStack_e0;
    pQVar2 = local_e8;
    local_d8 = 0;
    local_e8 = (QArrayData *)0x0;
    pcStack_e0 = (char16_t *)0x0;
    pQVar6 = QSqlDatabase::driver((QSqlDatabase *)(lVar1 + 0x228));
    QSqlField::name(&local_120,(QSqlField *)&local_68);
    (**(code **)(*(long *)pQVar6 + 0xa0))(&local_108,pQVar6,&local_120);
    local_a8.b.d.size = local_f8;
    local_a8.b.d.ptr = pcStack_100;
    local_a8.b.d.d = (Data *)local_108;
    local_a8.a.a.d.d = (Data *)pQVar2;
    local_a8.a.a.d.ptr = pcVar3;
    local_a8.a.a.d.size = qVar4;
    local_a8.a.b = L'.';
    local_108 = (QArrayData *)0x0;
    pcStack_100 = (char16_t *)0x0;
    local_f8 = 0;
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
              (&local_c8,&local_a8);
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_a8);
    if (local_108 != (QArrayData *)0x0) {
      LOCK();
      (local_108->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_108,2,0x10);
      }
    }
    if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_e8 != (QArrayData *)0x0) {
      LOCK();
      (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_e8,2,0x10);
      }
    }
    if (*(int *)(lVar1 + 0x234) == 0) {
      QSqlQueryModelSql::asc((QString *)&local_a8,&local_c8);
    }
    else {
      QSqlQueryModelSql::desc((QString *)&local_a8,&local_c8);
    }
    QString::operator=(&local_c8,(QString *)&local_a8);
    if (&(local_a8.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    QSqlQueryModelSql::orderBy(__return_storage_ptr__,&local_c8);
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  QSqlField::~QSqlField((QSqlField *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlTableModel::orderByClause() const
{
    Q_D(const QSqlTableModel);
    QSqlField f = d->rec.field(d->sortColumn);
    if (!f.isValid())
        return QString();

    //we can safely escape the field because it would have been obtained from the database
    //and have the correct case
    QString field = d->db.driver()->escapeIdentifier(d->tableName, QSqlDriver::TableName)
            + u'.'
            + d->db.driver()->escapeIdentifier(f.name(), QSqlDriver::FieldName);
    field = d->sortOrder == Qt::AscendingOrder ? SqlTm::asc(field) : SqlTm::desc(field);
    return SqlTm::orderBy(field);
}